

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::LeaveIdleDecommit(Recycler *this)

{
  code *pcVar1;
  IdleDecommitSignal IVar2;
  LONG LVar3;
  undefined4 *puVar4;
  ConfigFlagsTable *pCVar5;
  bool bVar6;
  IdleDecommitSignal idleDecommitSignal;
  bool allowTimer;
  Recycler *this_local;
  
  bVar6 = this->concurrentIdleDecommitEvent != (HANDLE)0x0;
  IVar2 = HeapInfoManager::LeaveIdleDecommit(&this->autoHeap,bVar6);
  if (IVar2 != IdleDecommitSignal_None) {
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x439,"(allowTimer)","allowTimer");
      if (!bVar6) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    if ((IVar2 == IdleDecommitSignal_NeedSignal) ||
       (LVar3 = InterlockedCompareExchange(&this->needIdleDecommitSignal,1,0), LVar3 == 2)) {
      pCVar5 = GetRecyclerFlagsTable(this);
      bVar6 = Js::Phases::IsEnabled(&pCVar5->Trace,IdleDecommitPhase);
      if (bVar6) {
        Output::Print(L"Recycler Thread IdleDecommit Need Signal\n");
        Output::Flush();
      }
      SetEvent(this->concurrentIdleDecommitEvent);
    }
  }
  return;
}

Assistant:

void
Recycler::LeaveIdleDecommit()
{
#ifdef IDLE_DECOMMIT_ENABLED
    bool allowTimer = (this->concurrentIdleDecommitEvent != nullptr);
    IdleDecommitSignal idleDecommitSignal = autoHeap.LeaveIdleDecommit(allowTimer);

    if (idleDecommitSignal != IdleDecommitSignal_None)
    {
        Assert(allowTimer);
        // Reduce the number of times we need to signal the background thread
        // by detecting whether the thread is waiting on a time out or not
        if (idleDecommitSignal == IdleDecommitSignal_NeedSignal ||
            ::InterlockedCompareExchange(&needIdleDecommitSignal, IdleDecommitSignal_NeedTimer, IdleDecommitSignal_None) == IdleDecommitSignal_NeedSignal)
        {
#if DBG
            if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::IdleDecommitPhase))
            {
                Output::Print(_u("Recycler Thread IdleDecommit Need Signal\n"));
                Output::Flush();
            }
#endif

#pragma prefast(suppress:6387, "INVALID_PARAM_VALUE_1 We will never reach here if concurrentIdleDecommitEvent is NULL.");
            SetEvent(this->concurrentIdleDecommitEvent);
        }
    }

#else
    autoHeap.LeaveIdleDecommit(false /*allowTimer*/);
#endif
}